

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricProgrammableGetParamInfoExpPrologue
          (ZETParameterValidation *this,zet_metric_programmable_exp_handle_t hMetricProgrammable,
          uint32_t *pParameterCount,zet_metric_programmable_param_info_exp_t *pParameterInfo)

{
  ze_result_t zVar1;
  
  if (hMetricProgrammable == (zet_metric_programmable_exp_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (pParameterCount != (uint32_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (pParameterInfo != (zet_metric_programmable_param_info_exp_t *)0x0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricProgrammableGetParamInfoExpPrologue(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t* pParameterCount,                      ///< [in,out] count of the parameters to retrieve parameter info.
                                                        ///< if value pParameterCount is greater than count of parameters
                                                        ///< available, then pParameterCount will be updated with count of
                                                        ///< parameters available.
                                                        ///< The count of parameters available can be queried using ::zetMetricProgrammableGetPropertiesExp.
        zet_metric_programmable_param_info_exp_t* pParameterInfo///< [in,out][range(1, *pParameterCount)] array of parameter info.
                                                        ///< if parameterCount is less than the number of parameters available,
                                                        ///< then driver shall only retrieve that number of parameter info.
        )
    {
        if( nullptr == hMetricProgrammable )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pParameterCount )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pParameterInfo )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }